

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_b
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  uint uVar1;
  pointer pdVar2;
  GLint GVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  iVar11 = configuration->m_n_attributes_per_group;
  uVar1 = configuration->m_n_elements[n_type];
  iVar5 = configuration->m_vertex_length;
  GVar3 = calculateAttributeGroupOffset(this,configuration,n_type);
  uVar4 = GVar3 + iVar5 * vertex;
  uVar7 = vertex * uVar1 + iVar11 * n_type;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  iVar5 = 0;
  if (iVar11 < 1) {
    iVar11 = 0;
    iVar5 = 0;
  }
  for (; iVar5 != iVar11; iVar5 = iVar5 + 1) {
    pdVar2 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = uVar6;
    uVar8 = uVar7;
    uVar9 = uVar4;
    while( true ) {
      bVar12 = uVar10 == 0;
      uVar10 = uVar10 - 1;
      if (bVar12) break;
      pdVar2[uVar9] = (double)uVar8;
      uVar9 = uVar9 + 1;
      uVar8 = uVar8 + 1;
    }
    uVar4 = uVar4 + uVar1;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void LimitTest::setAttributes_b(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
								std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	const GLint n_elements		= configuration.m_n_elements[n_type];
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Dvec3 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 3 + 0,
	 n_attribute + gl_VertexID * 3 + 1,
	 n_attribute + gl_VertexID * 3 + 2).

	 Dvec4 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 4 + 0,
	 n_attribute + gl_VertexID * 4 + 1,
	 n_attribute + gl_VertexID * 4 + 2,
	 n_attribute + gl_VertexID * 4 + 3).*/

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = n_elements * attribute + group_offset;

		for (GLint i = 0; i < n_elements; ++i)
		{
			out_buffer_data[attribute_offset + i] = attribute + attribute_index + vertex * n_elements + i;
		}
	}
}